

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  pointer psVar1;
  App *pAVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer ppAVar5;
  string *psVar6;
  pointer psVar7;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  ostream *poVar10;
  App **ppAVar11;
  pointer pbVar12;
  pointer ppAVar13;
  string group_key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  stringstream out;
  undefined1 local_278 [16];
  undefined1 local_268 [27];
  allocator_type local_24d [5];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_230;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_218;
  Formatter *local_200;
  string *local_1f8;
  App *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_24d._1_4_ = mode;
  local_200 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_268._0_8_ = (code *)0x0;
  local_268._8_8_ = (code *)0x0;
  local_278._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278._8_8_ = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_218,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_248);
  psVar1 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar11 = local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar7 = (app->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1) {
    *ppAVar11 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar11 = ppAVar11 + 1;
  }
  local_1f8 = __return_storage_ptr__;
  if ((code *)local_268._0_8_ != (code *)0x0) {
    _Var8 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                      ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        )local_218.
                         super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        )local_218.
                         super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_app_CLI11_hpp:8806:39)>
                        )local_278);
    if (_Var8._M_current !=
        local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var8;
    }
    if ((code *)local_268._0_8_ != (code *)0x0) {
      (*(code *)local_268._0_8_)(local_278,local_278,3);
    }
  }
  ppAVar5 = local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar13 = local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = *ppAVar13;
      if ((pAVar2->name_)._M_string_length == 0) {
        if (((pAVar2->group_)._M_string_length != 0) && (*(pAVar2->group_)._M_dataplus._M_p != '+'))
        {
          (*(local_200->super_FormatterBase)._vptr_FormatterBase[7])
                    (local_278,local_200,pAVar2,(ulong)(uint)local_24d._1_4_);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_278._0_8_,local_278._8_8_);
          goto LAB_001151d7;
        }
      }
      else {
        local_278._0_8_ = local_268;
        pcVar3 = (pAVar2->group_)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,pcVar3,pcVar3 + (pAVar2->group_)._M_string_length);
        if ((local_278._8_8_ != 0) &&
           (_Var9 = ::std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>>
                              (local_248.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_248.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,local_278),
           _Var9._M_current ==
           local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_248,(value_type *)local_278);
        }
LAB_001151d7:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
          operator_delete((void *)local_278._0_8_);
        }
      }
      ppAVar13 = ppAVar13 + 1;
    } while (ppAVar13 != ppAVar5);
    local_1e8 = local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1f0 = app;
      do {
        pAVar2 = local_1f0;
        local_278[0] = 10;
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_278,1);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\n",2);
        local_278._8_8_ = 0;
        local_268._8_8_ =
             std::
             _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11337:13)>
             ::_M_invoke;
        local_268._0_8_ =
             std::
             _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11337:13)>
             ::_M_manager;
        local_278._0_8_ = pbVar12;
        std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
                  (&local_230,
                   (long)(pAVar2->subcommands_).
                         super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pAVar2->subcommands_).
                         super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,local_24d);
        psVar1 = (pAVar2->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppAVar11 = local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        for (psVar7 = (pAVar2->subcommands_).
                      super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1;
            psVar7 = psVar7 + 1) {
          *ppAVar11 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          ppAVar11 = ppAVar11 + 1;
        }
        ppAVar11 = local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        _Var8._M_current =
             local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if ((code *)local_268._0_8_ != (code *)0x0) {
          _Var8 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                            ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                              )local_230.
                               super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                              )local_230.
                               super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_app_CLI11_hpp:8806:39)>
                              )local_278);
          if (_Var8._M_current !=
              local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)_Var8;
          }
          ppAVar11 = local_230.
                     super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if ((code *)local_268._0_8_ != (code *)0x0) {
            (*(code *)local_268._0_8_)(local_278,local_278,3);
            ppAVar11 = local_230.
                       super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            _Var8._M_current =
                 local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        for (; local_1e0 = pbVar12, ppAVar11 != _Var8._M_current; ppAVar11 = ppAVar11 + 1) {
          pAVar2 = *ppAVar11;
          sVar4 = (pAVar2->name_)._M_string_length;
          if (sVar4 != 0) {
            if (local_24d._1_4_ == All) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              pcVar3 = (pAVar2->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,pcVar3,pcVar3 + sVar4);
              App::help((string *)local_278,pAVar2,&local_1d8,Sub);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_278._0_8_,local_278._8_8_);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_278._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
                operator_delete((void *)local_278._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p);
              }
              local_278[0] = 10;
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_278,1);
            }
            else {
              (*(local_200->super_FormatterBase)._vptr_FormatterBase[6])(local_278,local_200,pAVar2)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_278._0_8_,local_278._8_8_);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_278._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
                operator_delete((void *)local_278._0_8_);
              }
            }
          }
          pbVar12 = local_1e0;
        }
        if (local_230.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (App **)0x0) {
          operator_delete(local_230.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        pbVar12 = local_1e0 + 1;
      } while (pbVar12 != local_1e8);
    }
  }
  psVar6 = local_1f8;
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  if (local_218.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_218.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        if(com->get_name().empty()) {
            if(!com->get_group().empty() && com->get_group().front() != '+') {
                out << make_expanded(com, mode);
            }
            continue;
        }
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << '\n' << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *sub_app) { return detail::to_lower(sub_app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(new_com->get_name().empty())
                continue;
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                out << '\n';
            }
        }
    }

    return out.str();
}